

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O0

int convert_8srp(uchar *data,_sample *gus_sample)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  short *psVar6;
  int *piVar7;
  byte *pbVar8;
  uchar *puVar9;
  short *local_60;
  short *write_data_b;
  short *write_data_a;
  short *write_data;
  uchar *read_end;
  uchar *read_data;
  unsigned_long new_length;
  unsigned_long dloop_length;
  unsigned_long loop_length;
  _sample *gus_sample_local;
  uchar *data_local;
  
  uVar3 = gus_sample->loop_end - gus_sample->loop_start;
  uVar4 = (ulong)uVar3;
  lVar5 = (ulong)gus_sample->data_length + uVar4 * 2;
  uVar1 = gus_sample->data_length;
  uVar2 = gus_sample->loop_end;
  psVar6 = (short *)calloc(lVar5 + 2,2);
  gus_sample->data = psVar6;
  if (gus_sample->data == (short *)0x0) {
    piVar7 = __errno_location();
    _WM_ERROR("convert_8srp",0xcc,1,"to parse sample",*piVar7);
    data_local._4_4_ = -1;
  }
  else {
    psVar6 = gus_sample->data;
    pbVar8 = data + ((ulong)uVar1 - 1);
    do {
      read_end = pbVar8;
      write_data_a = psVar6;
      pbVar8 = read_end + -1;
      psVar6 = write_data_a + 1;
      *write_data_a = (ushort)*read_end << 8;
    } while (pbVar8 != data + uVar2);
    *psVar6 = (ushort)*pbVar8 << 8;
    write_data_b = psVar6 + uVar4 * 2;
    *write_data_b = *psVar6;
    write_data_a = write_data_a + 2;
    uVar1 = gus_sample->loop_start;
    psVar6 = write_data_a + uVar4 * 2;
    pbVar8 = read_end + -2;
    do {
      read_end = pbVar8;
      local_60 = psVar6;
      write_data_b = write_data_b + -1;
      pbVar8 = read_end + -1;
      *write_data_a = (ushort)*read_end << 8;
      *write_data_b = *write_data_a;
      *local_60 = *write_data_a;
      write_data_a = write_data_a + 1;
      psVar6 = local_60 + 1;
    } while (pbVar8 != data + uVar1);
    *write_data_a = (ushort)*pbVar8 << 8;
    local_60[1] = *write_data_a;
    read_end = read_end + -2;
    do {
      local_60 = local_60 + 2;
      puVar9 = read_end + -1;
      *local_60 = (ushort)*read_end << 8;
      read_end = puVar9;
    } while (puVar9 != data + -1);
    gus_sample->loop_start = gus_sample->loop_start + uVar3;
    gus_sample->loop_end = gus_sample->loop_end + (int)(uVar4 * 2);
    gus_sample->data_length = (uint)lVar5;
    gus_sample->modes = gus_sample->modes ^ 0x18;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int convert_8srp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data + gus_sample->data_length - 1;
	unsigned char *read_end = data + gus_sample->loop_end;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc((new_length + 2), sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data++ = (*read_data--) << 8;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		write_data_a = write_data + dloop_length;
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + dloop_length;
		read_end = data + gus_sample->loop_start;
		do {
			*write_data = (*read_data--) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		*write_data_b++ = *write_data;
		read_end = data - 1;
		do {
			*write_data_b++ = (*read_data--) << 8;
			write_data_b++;
		} while (read_data != read_end);
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG | SAMPLE_REVERSE;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}